

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int pub_cmp_gost_ec(EVP_PKEY *a,EVP_PKEY *b)

{
  int iVar1;
  EC_KEY *key;
  EC_KEY *key_00;
  EC_POINT *a_00;
  EC_POINT *b_00;
  EC_GROUP *group;
  uint uVar2;
  
  key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)a);
  key_00 = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)b);
  uVar2 = 0;
  if (key_00 != (EC_KEY *)0x0 && key != (EC_KEY *)0x0) {
    a_00 = EC_KEY_get0_public_key(key);
    b_00 = EC_KEY_get0_public_key(key_00);
    if (b_00 != (EC_POINT *)0x0 && a_00 != (EC_POINT *)0x0) {
      group = EC_KEY_get0_group(key);
      iVar1 = EC_POINT_cmp(group,a_00,b_00,(BN_CTX *)0x0);
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

static int pub_cmp_gost_ec(const EVP_PKEY *a, const EVP_PKEY *b)
{
    const EC_KEY *ea = EVP_PKEY_get0((EVP_PKEY *)a);
    const EC_KEY *eb = EVP_PKEY_get0((EVP_PKEY *)b);
    const EC_POINT *ka, *kb;
    if (!ea || !eb)
        return 0;
    ka = EC_KEY_get0_public_key(ea);
    kb = EC_KEY_get0_public_key(eb);
    if (!ka || !kb)
        return 0;
    return (0 == EC_POINT_cmp(EC_KEY_get0_group(ea), ka, kb, NULL));
}